

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMixedHybridMeshControl::CreateSkeletonAxialFluxes(TPZMHMixedHybridMeshControl *this)

{
  int iVar1;
  TPZCompEl *pTVar2;
  TPZInterpolatedElement *pTVar3;
  TPZGeoEl *pTVar4;
  int64_t iel;
  _Base_ptr p_Var5;
  long iel_00;
  _Self __tmp;
  long lVar6;
  TPZManVector<TPZInterpolatedElement_*,_10> pressureelements;
  TPZGeoElSide local_c0;
  TPZInterpolatedElement *local_a8;
  TPZManVector<TPZInterpolatedElement_*,_10> local_a0;
  
  TPZGeoMesh::ResetReference
            (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer);
  lVar6 = (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fPressureFineMesh.fRef)->
           fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  local_a8 = (TPZInterpolatedElement *)0x0;
  TPZManVector<TPZInterpolatedElement_*,_10>::TPZManVector
            (&local_a0,
             (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer->
             fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements,&local_a8);
  iel_00 = 0;
  if (lVar6 < 1) {
    lVar6 = iel_00;
  }
  for (; lVar6 != iel_00; iel_00 = iel_00 + 1) {
    pTVar2 = TPZCompMesh::Element
                       (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.
                         fPressureFineMesh.fRef)->fPointer,iel_00);
    if (pTVar2 != (TPZCompEl *)0x0) {
      pTVar3 = (TPZInterpolatedElement *)
               __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      if (pTVar3 == (TPZInterpolatedElement *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedHybridMeshControl.cpp"
                   ,0x452);
      }
      pTVar4 = TPZCompEl::Reference(pTVar2);
      local_a0.super_TPZVec<TPZInterpolatedElement_*>.fStore[pTVar4->fIndex] = pTVar3;
    }
  }
  p_Var5 = *(_Base_ptr *)
            ((long)&(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fInterfaces._M_t.
                    _M_impl.super__Rb_tree_header._M_header + 0x10);
  do {
    if ((_Rb_tree_header *)p_Var5 ==
        &(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fInterfaces._M_t._M_impl.
         super__Rb_tree_header) {
      TPZManVector<TPZInterpolatedElement_*,_10>::~TPZManVector(&local_a0);
      return;
    }
    if ((*(_Base_ptr *)(p_Var5 + 1) != p_Var5[1]._M_left) &&
       (pTVar2 = (TPZCompEl *)
                 local_a0.super_TPZVec<TPZInterpolatedElement_*>.fStore
                 [(long)*(_Base_ptr *)(p_Var5 + 1)], pTVar2 != (TPZCompEl *)0x0)) {
      pTVar4 = TPZCompEl::Reference(pTVar2);
      iVar1 = pTVar4->fMatId;
      pTVar4 = TPZGeoMesh::Element(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.
                                    fGMesh.fRef)->fPointer,*(int64_t *)(p_Var5 + 1));
      local_c0.fSide = (**(code **)(*(long *)pTVar4 + 0xf0))(pTVar4);
      local_c0.fSide = local_c0.fSide + -1;
      local_c0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      local_c0.fGeoEl = pTVar4;
      iel = HasNeighbour(&local_c0,&this->fSkeletonWithFlowMatId);
      if ((iel == -1) && (iVar1 == this->fSkeletonWithFlowPressureMatId)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedHybridMeshControl.cpp"
                   ,0x46c);
      }
      if (iel != -1) {
        pTVar4 = TPZGeoMesh::Element(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.
                                      fGMesh.fRef)->fPointer,iel);
        iVar1 = pTVar4->fMatId;
        pTVar4->fMatId = (this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fSkeletonMatId;
        CreateAxialFluxElement(this,(TPZInterpolatedElement *)pTVar2,iVar1);
      }
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void TPZMHMixedHybridMeshControl::CreateSkeletonAxialFluxes()
{
    fGMesh->ResetReference();
    // create a vector that points a geometric element index to a pressure computational element
    int64_t nel = fPressureFineMesh->NElements();
    TPZManVector<TPZInterpolatedElement *> pressureelements(fGMesh->NElements(),0);
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        if (!cel) {
            continue;
        }
        TPZInterpolatedElement *press = dynamic_cast<TPZInterpolatedElement *>(cel);
        if(!press) DebugStop();
#ifdef PZDEBUG
        if (!cel->Reference()) {
            DebugStop();
        }
#endif
        TPZGeoEl *gel = cel->Reference();
        pressureelements[gel->Index()] = press;
    }
    /// indices of the skeleton elements and their left/right geometric elements of the skeleton mesh
//    std::map<int64_t, std::pair<int64_t,int64_t> > fInterfaces;
    for (auto it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        TPZInterpolatedElement *press = pressureelements[it->first];
        if (!press) {
            continue;
        }
        int pressmatid = press->Reference()->MaterialId();
        TPZGeoEl *gel = fGMesh->Element(it->first);
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        int64_t elindex = -1;
        elindex = HasNeighbour(gelside, fSkeletonWithFlowMatId);
        if (pressmatid == fSkeletonWithFlowPressureMatId && elindex == -1) {
            DebugStop();
        }
        if (elindex == -1) {
            continue;
        }
        TPZGeoEl *gelflux = fGMesh->Element(elindex);
        int gelfluxmatid = gelflux->MaterialId();
#ifdef PZDEBUG
        {
            // if two fracture flow elements would be created, an error in the datastructure occurred
            TPZGeoEl *gel = fGMesh->Element(it->first);
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            if (HasNeighbour(gelside, fFractureFlowDim1MatId) != -1) {
                DebugStop();
            }
        }
#endif
        gelflux->SetMaterialId(fSkeletonMatId);
        CreateAxialFluxElement(press, gelfluxmatid);
    }
}